

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O2

void __thiscall wasm::DAEScanner::~DAEScanner(DAEScanner *this)

{
  WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>::
  ~WalkerPass(&this->
               super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
             );
  operator_delete(this,0x120);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }